

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O2

void __thiscall
versionbits_tests::versionbits_computeblockversion::test_method
          (versionbits_computeblockversion *this)

{
  long lVar1;
  uint32_t uVar2;
  long lVar3;
  int iVar4;
  iterator in_R8;
  iterator in_R9;
  uint uVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar6;
  allocator<char> local_381;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  string local_348;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_318;
  ArgsManager args;
  VersionBitsCache vbcache;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VersionBitsCache::VersionBitsCache(&vbcache);
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    CreateChainParams((ArgsManager *)&chainParams,
                      (ChainType)(this->super_BlockVersionTest).super_BasicTestingSetup.m_node.args)
    ;
    uVar5 = 0;
    for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
      uVar2 = VersionBitsCache::Mask
                        ((Params *)
                         chainParams._M_t.
                         super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                         .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,
                         (DeploymentPos)iVar4);
      local_360 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_358 = "";
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      local_368 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1b6;
      file.m_begin = (iterator)&local_360;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_370,msg)
      ;
      chainParams_1._M_t.
      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>._M_t.
      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>.
      super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl._0_1_ = (uVar2 & uVar5) == 0;
      aStack_318._M_allocated_capacity = 0;
      local_348._M_dataplus._M_p = "!(chain_all_vbits & dep_mask)";
      local_348._M_string_length = (long)"!(chain_all_vbits & dep_mask)" + 0x1d;
      args.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__size[8] = '\0';
      args.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align =
           (long)&PTR__lazy_ostream_011481f0;
      args.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      args.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev
           = (__pthread_internal_list *)&local_348;
      local_380 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_378 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&chainParams_1,(lazy_ostream *)&args,1,0,WARN,_cVar6,
                 (size_t)&local_380,0x1b6);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_318._M_allocated_capacity);
      BlockVersionTest::check_computeblockversion
                (&this->super_BlockVersionTest,&vbcache,
                 (Params *)
                 chainParams._M_t.
                 super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                 .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,
                 (DeploymentPos)iVar4);
      uVar5 = uVar5 | uVar2;
    }
    std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
              (&chainParams);
  }
  ArgsManager::ArgsManager(&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chainParams_1,"-vbparams",(allocator<char> *)&chainParams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"testdummy:1199145601:1230767999",&local_381);
  ArgsManager::ForceSetArg(&args,(string *)&chainParams_1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&chainParams_1);
  CreateChainParams((ArgsManager *)&chainParams_1,(ChainType)&args);
  BlockVersionTest::check_computeblockversion
            (&this->super_BlockVersionTest,&vbcache,
             (Params *)
             CONCAT71(chainParams_1._M_t.
                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                      .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl._1_7_,
                      chainParams_1._M_t.
                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                      .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl._0_1_),
             DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams_1);
  ArgsManager::~ArgsManager(&args);
  ArgsManager::ArgsManager(&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chainParams_1,"-vbparams",(allocator<char> *)&chainParams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"testdummy:1199145601:1230767999:403200",&local_381);
  ArgsManager::ForceSetArg(&args,(string *)&chainParams_1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&chainParams_1);
  CreateChainParams((ArgsManager *)&chainParams_1,(ChainType)&args);
  BlockVersionTest::check_computeblockversion
            (&this->super_BlockVersionTest,&vbcache,
             (Params *)
             CONCAT71(chainParams_1._M_t.
                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                      .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl._1_7_,
                      chainParams_1._M_t.
                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                      .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl._0_1_),
             DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams_1);
  ArgsManager::~ArgsManager(&args);
  VersionBitsCache::~VersionBitsCache(&vbcache);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(versionbits_computeblockversion, BlockVersionTest)
{
    VersionBitsCache vbcache;

    // check that any deployment on any chain can conceivably reach both
    // ACTIVE and FAILED states in roughly the way we expect
    for (const auto& chain_type: {ChainType::MAIN, ChainType::TESTNET, ChainType::TESTNET4, ChainType::SIGNET, ChainType::REGTEST}) {
        const auto chainParams = CreateChainParams(*m_node.args, chain_type);
        uint32_t chain_all_vbits{0};
        for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++i) {
            const auto dep = static_cast<Consensus::DeploymentPos>(i);
            // Check that no bits are reused (within the same chain). This is
            // disallowed because the transition to FAILED (on timeout) does
            // not take precedence over STARTED/LOCKED_IN. So all softforks on
            // the same bit might overlap, even when non-overlapping start-end
            // times are picked.
            const uint32_t dep_mask{vbcache.Mask(chainParams->GetConsensus(), dep)};
            BOOST_CHECK(!(chain_all_vbits & dep_mask));
            chain_all_vbits |= dep_mask;
            check_computeblockversion(vbcache, chainParams->GetConsensus(), dep);
        }
    }

    {
        // Use regtest/testdummy to ensure we always exercise some
        // deployment that's not always/never active
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999"); // January 1, 2008 - December 31, 2008
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }

    {
        // Use regtest/testdummy to ensure we always exercise the
        // min_activation_height test, even if we're not using that in a
        // live deployment
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999:403200"); // January 1, 2008 - December 31, 2008, min act height 403200
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }
}